

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_spec.cpp
# Opt level: O0

void readLine(filebuf *file,string *buffer)

{
  bool bVar1;
  int iVar2;
  int_type iVar3;
  reference pvVar4;
  int_type c;
  string *buffer_local;
  filebuf *file_local;
  
  while( true ) {
    iVar2 = std::streambuf::sbumpc();
    iVar3 = std::char_traits<char>::eof();
    if (iVar2 == iVar3) {
      return;
    }
    if (iVar2 == 10) break;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (buffer,(char)iVar2);
  }
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    (buffer);
  if (bVar1) {
    return;
  }
  pvVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::back
                     (buffer);
  if (*pvVar4 != '\r') {
    return;
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back(buffer);
  return;
}

Assistant:

static void readLine(std::filebuf &file, std::string &buffer) {
	// TODO: maybe this can be optimized to bulk reads?
	for (;;) {
		auto c = file.sbumpc();
		if (c == std::filebuf::traits_type::eof()) {
			return;
		}
		if (c == '\n') {
			// Discard a trailing CRLF
			if (!buffer.empty() && buffer.back() == '\r') {
				buffer.pop_back();
			}
			return;
		}

		buffer.push_back(c);
	}
}